

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v6::internal::float_writer<char>::prettify<char*>(float_writer<char> *this,char *it)

{
  char *__s;
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  byte *__s_00;
  byte *pbVar7;
  char *pcVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  size_t sVar12;
  byte bVar13;
  ptrdiff_t _Num;
  ulong __n;
  
  iVar2 = this->num_digits_;
  uVar9 = this->exp_ + iVar2;
  if ((this->specs_).field_0x4 == '\x01') {
    *it = *this->digits_;
    iVar2 = this->num_digits_;
    iVar3 = (this->specs_).precision;
    uVar11 = iVar3 - iVar2;
    bVar13 = (byte)(*(uint *)&(this->specs_).field_0x4 >> 0x15) & 1 &
             (uVar11 != 0 && iVar2 <= iVar3);
    if ((iVar2 < 2) && (bVar13 == 0)) {
      pcVar6 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pcVar6 = it + 2;
      iVar2 = this->num_digits_;
    }
    if (iVar2 != 1) {
      memmove(pcVar6,this->digits_ + 1,(long)iVar2 - 1U);
    }
    __s_00 = (byte *)(pcVar6 + ((long)iVar2 - 1U));
    pbVar7 = __s_00;
    if (bVar13 != 0) {
      pbVar7 = __s_00 + uVar11;
      memset(__s_00,0x30,(ulong)uVar11);
    }
    *pbVar7 = ((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pcVar6 = write_exponent<char,char*>(uVar9 - 1,(char *)(pbVar7 + 1));
    return pcVar6;
  }
  if (this->exp_ < 0) {
    if ((int)uVar9 < 1) {
      *it = '0';
      uVar10 = -uVar9;
      uVar11 = (this->specs_).precision;
      uVar4 = uVar10;
      if (SBORROW4(uVar11,uVar10) != (int)(uVar11 + uVar9) < 0) {
        uVar4 = uVar11;
      }
      if ((int)uVar11 < 0) {
        uVar4 = uVar10;
      }
      uVar9 = this->num_digits_;
      if (0 < (int)uVar9 && ((this->specs_).field_0x6 & 0x20) == 0) {
        do {
          if (this->digits_[(ulong)uVar9 - 1] != '0') goto LAB_0011e0a8;
          bVar1 = 1 < (int)uVar9;
          uVar9 = uVar9 - 1;
        } while (bVar1);
        uVar9 = 0;
      }
      if (uVar4 == 0 && uVar9 == 0) {
        pcVar6 = it + 1;
      }
      else {
LAB_0011e0a8:
        it[1] = this->decimal_point_;
        pcVar8 = it + 2;
        pcVar6 = pcVar8;
        if (0 < (int)uVar4) {
          pcVar6 = pcVar8 + uVar4;
          memset(pcVar8,0x30,(ulong)uVar4);
        }
        if (uVar9 != 0) {
          memmove(pcVar6,this->digits_,(long)(int)uVar9);
        }
        pcVar6 = pcVar6 + (int)uVar9;
      }
    }
    else {
      __n = (ulong)uVar9;
      memmove(it,this->digits_,__n);
      pcVar6 = it + __n;
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        uVar11 = this->num_digits_;
        lVar5 = (long)(int)uVar11;
        uVar4 = uVar9;
        if ((int)uVar11 < (int)uVar9) {
          uVar4 = uVar11;
        }
        for (; (long)__n < lVar5; lVar5 = lVar5 + -1) {
          if (this->digits_[lVar5 + -1] != '0') {
            uVar4 = (uint)lVar5;
            break;
          }
        }
        if (uVar4 == uVar9) {
          sVar12 = (long)(int)uVar4 - __n;
        }
        else {
          *pcVar6 = this->decimal_point_;
          pcVar6 = pcVar6 + 1;
          sVar12 = (long)(int)uVar4 - __n;
          memmove(pcVar6,this->digits_ + __n,sVar12);
        }
        pcVar6 = pcVar6 + sVar12;
      }
      else {
        *pcVar6 = this->decimal_point_;
        sVar12 = (long)this->num_digits_ - __n;
        if (this->num_digits_ != uVar9) {
          memmove(pcVar6 + 1,this->digits_ + __n,sVar12);
          uVar9 = this->num_digits_;
        }
        pcVar6 = pcVar6 + 1 + sVar12;
        iVar2 = (this->specs_).precision;
        uVar11 = iVar2 - uVar9;
        if ((uVar11 != 0 && (int)uVar9 <= iVar2) && (uVar11 != 0 && (int)uVar9 <= iVar2)) {
          memset(pcVar6,0x30,(ulong)uVar11);
          pcVar6 = pcVar6 + uVar11;
        }
      }
    }
  }
  else {
    if (iVar2 == 0) {
      iVar3 = 0;
    }
    else {
      memmove(it,this->digits_,(long)iVar2);
      iVar3 = this->num_digits_;
    }
    pcVar6 = it + iVar2;
    uVar11 = uVar9 - iVar3;
    pcVar8 = pcVar6;
    if (uVar11 != 0 && iVar3 <= (int)uVar9) {
      pcVar8 = pcVar6 + uVar11;
      memset(pcVar6,0x30,(ulong)uVar11);
    }
    pcVar6 = pcVar8;
    if (((this->specs_).field_0x6 & 0x20) != 0) {
      __s = pcVar8 + 1;
      *pcVar8 = this->decimal_point_;
      iVar2 = (this->specs_).precision;
      uVar11 = iVar2 - uVar9;
      if (uVar11 == 0 || iVar2 < (int)uVar9) {
        pcVar6 = __s;
        if ((this->specs_).field_0x4 != '\x02') {
          pcVar8[1] = '0';
          pcVar6 = pcVar8 + 2;
        }
      }
      else {
        pcVar6 = __s + uVar11;
        memset(__s,0x30,(ulong)uVar11);
      }
    }
  }
  return pcVar6;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }